

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<int,_bool,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<int,_bool,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  code *pcVar3;
  uint newSize;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  uint uVar7;
  undefined4 *puVar8;
  SimpleDictionaryEntry<int,_bool> *dst;
  Type pSVar9;
  size_t requestedBytes;
  long lVar10;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  long lVar11;
  uint bucketCount;
  size_t dstCount;
  int *local_48;
  int *newBuckets;
  EntryType *local_38;
  
  uVar1 = this->count;
  newSize = uVar1 * 2;
  bucketCount = 4;
  if ((8 < newSize) && (bucketCount = uVar1 & 0x7fffffff, (uVar1 - 1 & bucketCount) != 0)) {
    iVar6 = 0x1f;
    if (bucketCount != 0) {
      for (; bucketCount >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    bucketCount = 1 << (-((byte)iVar6 ^ 0x1f) & 0x1f);
  }
  local_48 = (Type)0x0;
  local_38 = (SimpleDictionaryEntry<int,_bool> *)0x0;
  if (bucketCount == this->bucketCount) {
    if (newSize == 0) {
      dst = (SimpleDictionaryEntry<int,_bool> *)&DAT_00000008;
      dstCount = 0;
    }
    else {
      dstCount = (size_t)(int)newSize;
      this_00 = &this->alloc->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = dstCount;
      requestedBytes = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
        requestedBytes = SUB168(auVar2 * ZEXT816(0xc),0);
      }
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        newBuckets = (int *)this_00;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_00cffc48;
        *puVar8 = 0;
        this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)newBuckets;
      }
      if (requestedBytes == 0) {
        AssertCount = AssertCount + 1;
        newBuckets = (int *)this_00;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                           "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
        if (!bVar4) goto LAB_00cffc48;
        *puVar8 = 0;
        this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)newBuckets;
      }
      dst = (SimpleDictionaryEntry<int,_bool> *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            AllocInternal(this_00,requestedBytes);
      memset(dst,0,requestedBytes);
      memset(&(dst->
              super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>).
              super_KeyValueEntry<int,_bool>.
              super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
              .super_KeyValueEntryDataLayout2<int,_bool>.value + requestedBytes,0,
             (requestedBytes + 0xf & 0xfffffffffffffff0) - requestedBytes);
      if (dst == (SimpleDictionaryEntry<int,_bool> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) {
LAB_00cffc48:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
        dst = (SimpleDictionaryEntry<int,_bool> *)0x0;
      }
    }
    Memory::CopyArray<JsUtil::SimpleDictionaryEntry<int,bool>,bool,Memory::ArenaAllocator>
              (dst,dstCount,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = dst;
    this->size = newSize;
    this->modFunctionIndex = 0x4b;
  }
  else {
    Allocate(this,&local_48,&local_38,bucketCount,newSize);
    Memory::CopyArray<JsUtil::SimpleDictionaryEntry<int,bool>,bool,Memory::ArenaAllocator>
              (local_38,(long)(int)newSize,this->entries,(long)this->count);
    this->modFunctionIndex = 0x4b;
    iVar6 = this->count;
    if (0 < iVar6) {
      lVar10 = 4;
      lVar11 = 0;
      pSVar9 = local_38;
      do {
        if (-2 < *(int *)(&(pSVar9->
                           super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                           ).super_KeyValueEntry<int,_bool>.
                           super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
                           .super_KeyValueEntryDataLayout2<int,_bool>.value + lVar10)) {
          uVar7 = GetBucket(*(int *)((long)&(pSVar9->
                                            super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                            ).super_KeyValueEntry<int,_bool>.
                                            super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
                                            .super_KeyValueEntryDataLayout2<int,_bool>.next + lVar10
                                    ) * 2 + 1,bucketCount,this->modFunctionIndex);
          *(int *)(&(local_38->
                    super_DefaultHashedEntry<int,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    ).super_KeyValueEntry<int,_bool>.
                    super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_bool>_>
                    .super_KeyValueEntryDataLayout2<int,_bool>.value + lVar10) =
               local_48[(int)uVar7];
          local_48[(int)uVar7] = (int)lVar11;
          iVar6 = this->count;
          pSVar9 = local_38;
        }
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 0xc;
      } while (lVar11 < iVar6);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_48;
    this->entries = local_38;
    this->bucketCount = bucketCount;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }